

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

bool tinyusdz::is_identity(matrix4d *m)

{
  bool bVar1;
  bool local_11;
  matrix4d *m_local;
  
  bVar1 = math::almost_equals_by_ulps(m->m[0][0],1.0,1);
  local_11 = false;
  if (bVar1) {
    bVar1 = math::almost_equals_by_ulps(m->m[0][1],0.0,1);
    local_11 = false;
    if (bVar1) {
      bVar1 = math::almost_equals_by_ulps(m->m[0][2],0.0,1);
      local_11 = false;
      if (bVar1) {
        bVar1 = math::almost_equals_by_ulps(m->m[0][3],0.0,1);
        local_11 = false;
        if (bVar1) {
          bVar1 = math::almost_equals_by_ulps(m->m[1][0],0.0,1);
          local_11 = false;
          if (bVar1) {
            bVar1 = math::almost_equals_by_ulps(m->m[1][1],1.0,1);
            local_11 = false;
            if (bVar1) {
              bVar1 = math::almost_equals_by_ulps(m->m[1][2],0.0,1);
              local_11 = false;
              if (bVar1) {
                bVar1 = math::almost_equals_by_ulps(m->m[1][3],0.0,1);
                local_11 = false;
                if (bVar1) {
                  bVar1 = math::almost_equals_by_ulps(m->m[2][0],0.0,1);
                  local_11 = false;
                  if (bVar1) {
                    bVar1 = math::almost_equals_by_ulps(m->m[2][1],0.0,1);
                    local_11 = false;
                    if (bVar1) {
                      bVar1 = math::almost_equals_by_ulps(m->m[2][2],1.0,1);
                      local_11 = false;
                      if (bVar1) {
                        bVar1 = math::almost_equals_by_ulps(m->m[2][3],0.0,1);
                        local_11 = false;
                        if (bVar1) {
                          bVar1 = math::almost_equals_by_ulps(m->m[3][0],0.0,1);
                          local_11 = false;
                          if (bVar1) {
                            bVar1 = math::almost_equals_by_ulps(m->m[3][1],0.0,1);
                            local_11 = false;
                            if (bVar1) {
                              bVar1 = math::almost_equals_by_ulps(m->m[3][2],0.0,1);
                              local_11 = false;
                              if (bVar1) {
                                local_11 = math::almost_equals_by_ulps(m->m[3][3],1.0,1);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool is_identity(const value::matrix4d &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][1], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][2], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][3], 1.0, uint64_t(kIdentityMaxUlps));
}